

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void round_shift_4x4_avx2(__m256i *in,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  int iVar6;
  undefined1 auVar7 [32];
  
  if (shift != 0) {
    iVar6 = 1 << ((char)shift - 1U & 0x1f);
    auVar7._4_4_ = iVar6;
    auVar7._0_4_ = iVar6;
    auVar7._8_4_ = iVar6;
    auVar7._12_4_ = iVar6;
    auVar7._16_4_ = iVar6;
    auVar7._20_4_ = iVar6;
    auVar7._24_4_ = iVar6;
    auVar7._28_4_ = iVar6;
    auVar1 = vpaddd_avx2(auVar7,(undefined1  [32])*in);
    auVar2 = vpaddd_avx2(auVar7,(undefined1  [32])in[1]);
    auVar3 = vpaddd_avx2(auVar7,(undefined1  [32])in[2]);
    auVar7 = vpaddd_avx2(auVar7,(undefined1  [32])in[3]);
    alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)shift));
    alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)shift));
    *in = alVar4;
    in[1] = alVar5;
    alVar4 = (__m256i)vpsrad_avx2(auVar3,ZEXT416((uint)shift));
    in[2] = alVar4;
    alVar4 = (__m256i)vpsrad_avx2(auVar7,ZEXT416((uint)shift));
    in[3] = alVar4;
  }
  return;
}

Assistant:

static inline void round_shift_4x4_avx2(__m256i *in, int shift) {
  if (shift != 0) {
    __m256i rnding = _mm256_set1_epi32(1 << (shift - 1));
    in[0] = _mm256_add_epi32(in[0], rnding);
    in[1] = _mm256_add_epi32(in[1], rnding);
    in[2] = _mm256_add_epi32(in[2], rnding);
    in[3] = _mm256_add_epi32(in[3], rnding);

    in[0] = _mm256_srai_epi32(in[0], shift);
    in[1] = _mm256_srai_epi32(in[1], shift);
    in[2] = _mm256_srai_epi32(in[2], shift);
    in[3] = _mm256_srai_epi32(in[3], shift);
  }
}